

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void duckdb::StringValueResult::AddValue(StringValueResult *result,idx_t buffer_pos)

{
  LinePosition *error_position;
  ulong uVar1;
  ulong uVar2;
  idx_t size;
  InternalException *this;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  string local_50;
  
  uVar1 = (result->super_ScannerResult).last_position.buffer_pos;
  if (uVar1 <= buffer_pos) {
    error_position = &(result->super_ScannerResult).last_position;
    if ((result->super_ScannerResult).quoted == true) {
      uVar1 = result->extra_delimiter_bytes;
      uVar5 = buffer_pos - uVar1;
      if ((result->super_ScannerResult).unquoted == false) {
        local_50._M_dataplus._M_p._0_1_ = 4;
        LineError::Insert(&result->current_errors,(CSVErrorType *)&local_50,&result->cur_col_id,
                          &result->chunk_col_id,error_position,0);
      }
      uVar2 = (result->super_ScannerResult).quoted_position;
      lVar3 = ~uVar2 + uVar5;
      if ((lVar3 != 0) && (result->ignore_empty_values == true)) {
        pcVar4 = result->buffer_ptr + ~uVar1 + buffer_pos;
        do {
          if (*pcVar4 != ' ') goto LAB_0151a8a8;
          pcVar4 = pcVar4 + -1;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
        lVar3 = 0;
      }
LAB_0151a8a8:
      AddPossiblyEscapedValue
                (result,uVar5,result->buffer_ptr + uVar2 + 1,lVar3 - 1,
                 uVar5 < (result->super_ScannerResult).last_position.buffer_pos + 2);
      (result->super_ScannerResult).quoted = false;
    }
    else if ((result->super_ScannerResult).escaped == true) {
      AddPossiblyEscapedValue(result,buffer_pos,result->buffer_ptr + uVar1,buffer_pos - uVar1,false)
      ;
    }
    else {
      uVar5 = result->extra_delimiter_bytes + uVar1;
      size = buffer_pos - uVar5;
      if (buffer_pos < uVar5) {
        if (buffer_pos != uVar1) {
          this = (InternalException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Value size is lower than the number of extra delimiter bytes in the HandleMultiDelimiter(). buffer_pos = %d, last_position.buffer_pos = %d, extra_delimiter_bytes = %d"
                     ,"");
          InternalException::InternalException<unsigned_long,unsigned_long,unsigned_long>
                    (this,&local_50,buffer_pos,
                     (result->super_ScannerResult).last_position.buffer_pos,
                     result->extra_delimiter_bytes);
          __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        size = 0;
      }
      AddValueToVector(result,result->buffer_ptr + uVar1,size,false);
    }
    error_position->buffer_pos = buffer_pos + 1;
  }
  return;
}

Assistant:

void StringValueResult::AddValue(StringValueResult &result, const idx_t buffer_pos) {
	if (result.last_position.buffer_pos > buffer_pos) {
		return;
	}
	if (result.quoted) {
		AddQuotedValue(result, buffer_pos - result.extra_delimiter_bytes);
	} else if (result.escaped) {
		AddPossiblyEscapedValue(result, buffer_pos, result.buffer_ptr + result.last_position.buffer_pos,
		                        buffer_pos - result.last_position.buffer_pos, false);
	} else {
		result.AddValueToVector(result.buffer_ptr + result.last_position.buffer_pos,
		                        result.HandleMultiDelimiter(buffer_pos));
	}
	result.last_position.buffer_pos = buffer_pos + 1;
}